

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadProcessGroup.h
# Opt level: O0

void __thiscall
IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true>::ProcessGroup
          (ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true> *this,uint numThreads
          )

{
  reference pvVar1;
  uint in_ESI;
  atomic<Imf_3_3::(anonymous_namespace)::ScanLineProcess_*> *in_RDI;
  Semaphore *unaff_retaddr;
  uint i;
  reference in_stack_ffffffffffffffb8;
  atomic<Imf_3_3::(anonymous_namespace)::ScanLineProcess_*> *this_00;
  atomic<Imf_3_3::(anonymous_namespace)::ScanLineProcess_*> *__new_size;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffe4;
  
  this_00 = in_RDI;
  Semaphore::Semaphore(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20));
  __new_size = in_RDI + 5;
  std::
  vector<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_3::(anonymous_namespace)::ScanLineProcess>_>
  ::vector((vector<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_3::(anonymous_namespace)::ScanLineProcess>_>
            *)0x9bc21b);
  std::atomic<Imf_3_3::(anonymous_namespace)::ScanLineProcess_*>::atomic
            (this_00,in_stack_ffffffffffffffb8);
  std::atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
  atomic((atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          *)this_00,(__pointer_type)in_stack_ffffffffffffffb8);
  std::
  vector<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_3::(anonymous_namespace)::ScanLineProcess>_>
  ::resize((vector<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_3::(anonymous_namespace)::ScanLineProcess>_>
            *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(size_type)__new_size);
  for (uVar2 = 0; uVar2 < in_ESI; uVar2 = uVar2 + 1) {
    if (uVar2 == in_ESI - 1) {
      pvVar1 = std::
               vector<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_3::(anonymous_namespace)::ScanLineProcess>_>
               ::operator[]((vector<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_3::(anonymous_namespace)::ScanLineProcess>_>
                             *)(this_00 + 5),(ulong)uVar2);
      pvVar1->next = (ScanLineProcess *)0x0;
    }
    else {
      in_stack_ffffffffffffffb8 =
           std::
           vector<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_3::(anonymous_namespace)::ScanLineProcess>_>
           ::operator[]((vector<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_3::(anonymous_namespace)::ScanLineProcess>_>
                         *)(this_00 + 5),(ulong)(uVar2 + 1));
      pvVar1 = std::
               vector<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_3::(anonymous_namespace)::ScanLineProcess>_>
               ::operator[]((vector<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_3::(anonymous_namespace)::ScanLineProcess>_>
                             *)(this_00 + 5),(ulong)uVar2);
      pvVar1->next = in_stack_ffffffffffffffb8;
    }
  }
  std::
  vector<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_3::(anonymous_namespace)::ScanLineProcess>_>
  ::operator[]((vector<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_3::(anonymous_namespace)::ScanLineProcess>_>
                *)(this_00 + 5),0);
  std::atomic<Imf_3_3::(anonymous_namespace)::ScanLineProcess_*>::operator=
            (this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

ProcessGroup (unsigned int numThreads)
        : _sem (numThreads)
        , _avail_head (nullptr)
        , _first_failure (nullptr)
    {
        _fixed_pool.resize (numThreads);
        for ( unsigned int i = 0; i < numThreads; ++i )
        {
            if (i == (numThreads - 1))
                _fixed_pool[i].next = nullptr;
            else
                _fixed_pool[i].next = &(_fixed_pool[i+1]);
        }
        _avail_head = &(_fixed_pool[0]);
    }